

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O0

void __thiscall
Nova::Grid_Iterator_Cell<float,_2>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_2> *this,Grid<float,_2> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  bool local_65;
  int local_60;
  int axis_3;
  int axis_2;
  T_INDEX max_copy;
  int axis_1;
  int axis;
  Range<int,_2> domain_copy;
  Range<int,_2> domain;
  int side_local;
  T_Region *region_type_local;
  int number_of_ghost_cells_local;
  Grid<float,_2> *grid_input_local;
  Grid_Iterator_Cell<float,_2> *this_local;
  
  domain.max_corner._data._M_elems[0] = side;
  unique0x100005f8 = region_type;
  Grid_Iterator<float,_2>::Grid_Iterator(&this->super_Grid_Iterator<float,_2>,grid_input);
  local_65 = 4 < (uint)domain.max_corner._data._M_elems[0];
  if (local_65) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  bVar4 = false;
  if (*stack0xffffffffffffffd8 != Boundary_Region) {
    bVar4 = *stack0xffffffffffffffd8 != Interior_Region;
  }
  if (!bVar4) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  Grid<float,_2>::Cell_Indices
            ((Grid<float,_2> *)&domain_copy.max_corner,
             (int)(this->super_Grid_Iterator<float,_2>).grid);
  if (*stack0xffffffffffffffd8 == Whole_Region) {
    if (domain.max_corner._data._M_elems[0] != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
    Grid_Iterator<float,_2>::Add_Region
              (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
  }
  else if (*stack0xffffffffffffffd8 == Boundary_Interior_Region) {
    if (domain.max_corner._data._M_elems[0] == 0) {
      Range<int,_2>::Range((Range<int,_2> *)&axis_1,(Range<int,_2> *)&domain_copy.max_corner);
      for (max_copy._data._M_elems[1] = 1; -1 < max_copy._data._M_elems[1];
          max_copy._data._M_elems[1] = max_copy._data._M_elems[1] + -1) {
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.max_corner,max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,max_copy._data._M_elems[1]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_2>::Add_Region
                  (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.min_corner,max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.max_corner,max_copy._data._M_elems[1]);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,max_copy._data._M_elems[1]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_2>::Add_Region
                  (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.min_corner,max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,max_copy._data._M_elems[1]);
        *piVar3 = iVar2 + -1;
        piVar3 = Vector<int,_2,_true>::operator()
                           ((Vector<int,_2,_true> *)&axis_1,max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.max_corner,max_copy._data._M_elems[1]);
        *piVar3 = iVar2 + 1;
      }
    }
    else {
      max_copy._data._M_elems[0] = (domain.max_corner._data._M_elems[0] + -1) / 2;
      if ((domain.max_corner._data._M_elems[0] & 1U) == 0) {
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.max_corner,max_copy._data._M_elems[0]);
        *piVar3 = iVar2;
      }
      else {
        piVar3 = Vector<int,_2,_true>::operator()
                           (&domain_copy.max_corner,max_copy._data._M_elems[0]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,max_copy._data._M_elems[0]);
        *piVar3 = iVar2;
      }
      Grid_Iterator<float,_2>::Add_Region
                (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
    }
  }
  else {
    if (*stack0xffffffffffffffd8 != Ghost_Region || number_of_ghost_cells < 1) {
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
    if (domain.max_corner._data._M_elems[0] == 0) {
      Vector<int,_2,_true>::Vector((Vector<int,_2,_true> *)&axis_3,&domain.min_corner);
      for (local_60 = 1; -1 < local_60; local_60 = local_60 + -1) {
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,local_60);
        *piVar3 = 0;
        Grid_Iterator<float,_2>::Add_Region
                  (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
        piVar3 = Vector<int,_2,_true>::operator()((Vector<int,_2,_true> *)&axis_3,local_60);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,local_60);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_2,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_2>).grid)->counts,local_60);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain_copy.max_corner,local_60);
        *piVar3 = iVar2 + 1;
        Grid_Iterator<float,_2>::Add_Region
                  (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
        piVar3 = Vector<int,_2,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_2>).grid)->counts,local_60);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,local_60);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_2,_true>::operator()(&domain_copy.max_corner,local_60);
        *piVar3 = 1;
      }
    }
    else {
      iVar2 = (domain.max_corner._data._M_elems[0] + -1) / 2;
      if ((domain.max_corner._data._M_elems[0] & 1U) == 0) {
        piVar3 = Vector<int,_2,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_2>).grid)->counts,iVar2);
        iVar1 = *piVar3;
        piVar3 = Vector<int,_2,_true>::operator()(&domain_copy.max_corner,iVar2);
        *piVar3 = iVar1 + 1;
      }
      else {
        piVar3 = Vector<int,_2,_true>::operator()(&domain.min_corner,iVar2);
        *piVar3 = 0;
      }
      Grid_Iterator<float,_2>::Add_Region
                (&this->super_Grid_Iterator<float,_2>,(Range<int,_2> *)&domain_copy.max_corner);
    }
  }
  Grid_Iterator<float,_2>::Reset(&this->super_Grid_Iterator<float,_2>,0);
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}